

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall preciseUnitOps_cast_Test::TestBody(preciseUnitOps_cast_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  precise_unit local_18;
  
  local_18.multiplier_ = (double)&DAT_3fd381d7e0000000;
  local_18.base_units_ = (unit_data)0x1;
  local_18.commodity_ = 0;
  testing::internal::CmpHelperNE<units::precise_unit,units::precise_unit>
            (local_28,"precise_unit(ft)","precise::ft",&local_18,(precise_unit *)units::precise::ft)
  ;
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_18);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x25d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((long *)local_18.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_18.multiplier_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_18.multiplier_ = 1.0;
  local_18.base_units_ = (unit_data)0x1;
  local_18.commodity_ = 0;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            (local_28,"precise_unit(m)","precise::m",&local_18,(precise_unit *)units::precise::m);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_18);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x25e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((long *)local_18.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_18.multiplier_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST(preciseUnitOps, cast)
{
    EXPECT_NE(precise_unit(ft), precise::ft);
    EXPECT_EQ(precise_unit(m), precise::m);
}